

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedVarintT<true,bool,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  FieldEntry *pFVar4;
  void *x;
  RepeatedField<bool> *this;
  uint32_t *data_00;
  ulong uVar5;
  uint *puVar6;
  char *pcVar7;
  ParseContext *extraout_RDX;
  ulong uVar8;
  ParseContext *ctx_00;
  uint32_t *out;
  uint value;
  ulong uVar9;
  int local_70;
  uint32_t next_tag;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_48;
  ParseContext *local_40;
  ulong local_38;
  
  local_48 = data.field_0;
  local_40 = ctx;
  pFVar4 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  uVar2 = pFVar4->type_card;
  x = MaybeGetSplitBase(msg,true,table);
  this = MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<bool>,true>
                   (x,(ulong)pFVar4->offset,msg);
  if ((uVar2 >> 10 & 1) == 0) {
    data_00 = (uint32_t *)0x0;
  }
  else {
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((long)&table->has_bits_offset + (ulong)table->aux_offset);
    data_00 = *(uint32_t **)((long)data.field_0 + (ulong)pFVar4->aux_idx * 8);
  }
  local_38 = (ulong)data_00 >> 0x20;
  do {
    uVar9 = (ulong)*ptr;
    if ((long)uVar9 < 0) {
      out = (uint32_t *)0xffffffffffffff80;
      uVar5 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar5 < 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)ptr[2] << 0xe | 0x3fff);
        if ((long)data.field_0 < 0) {
          uVar5 = uVar5 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar5 < 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           ((ulong)data.field_0 & ((long)ptr[4] << 0x1c | 0xfffffffU));
            if ((long)data.field_0 < 0) {
              uVar5 = uVar5 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar5 < 0) {
                data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                               ((ulong)data.field_0 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
                if ((long)data.field_0 < 0) {
                  uVar5 = uVar5 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar5 < 0) {
                    uVar8 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                                   ((ulong)data.field_0 & uVar8);
                    if ((long)data.field_0 < 0) {
                      pcVar7 = ptr + 10;
                      bVar1 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar8 >> 8),bVar1);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') goto LAB_001f0cdf;
                        if ((bVar1 & 1) == 0) {
                          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                                         ((ulong)data.field_0 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      pcVar7 = ptr + 9;
                    }
                  }
                  else {
                    pcVar7 = ptr + 8;
                  }
                }
                else {
                  pcVar7 = ptr + 7;
                }
              }
              else {
                pcVar7 = ptr + 6;
              }
            }
            else {
              pcVar7 = ptr + 5;
            }
          }
          else {
            pcVar7 = ptr + 4;
          }
        }
        else {
          pcVar7 = ptr + 3;
        }
        uVar5 = uVar5 & (ulong)data.field_0;
      }
      else {
        pcVar7 = ptr + 2;
      }
      uVar9 = uVar9 & uVar5;
    }
    else {
      pcVar7 = ptr + 1;
    }
    value = (uint)uVar9;
    if ((uVar2 >> 10 & 1) == 0) {
      if ((uVar2 & 0x600) == 0x200) {
        uVar9 = (ulong)(int)(-(value & 1) ^ (uint)(uVar9 >> 1) & 0x7fffffff);
      }
    }
    else if ((uVar2 & 0x600) == 0x600) {
      local_70 = (int)data_00;
      if (((int)value < local_70) || ((int)local_38 < (int)value)) {
LAB_001f0cb0:
        pcVar7 = MpUnknownEnumFallback(msg,ptr,local_40,(TcFieldData)local_48,table,hasbits);
        return pcVar7;
      }
    }
    else {
      bVar3 = ValidateEnum(value,data_00);
      if (!bVar3) goto LAB_001f0cb0;
    }
    RepeatedField<bool>::Add(this,uVar9 != 0);
    if ((local_40->super_EpsCopyInputStream).limit_end_ <= pcVar7) break;
    out = &next_tag;
    ptr = ReadTag(pcVar7,out,0);
    ctx_00 = extraout_RDX;
    if (ptr == (char *)0x0) {
LAB_001f0cdf:
      pcVar7 = Error(msg,(char *)out,ctx_00,data,table,hasbits);
      return pcVar7;
    }
  } while (next_tag == (uint32_t)local_48.data);
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)hasbits;
  }
  return pcVar7;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}